

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Preferences.cxx
# Opt level: O0

char __thiscall Fl_Preferences::set(Fl_Preferences *this,char *key,void *data,int dsize)

{
  byte bVar1;
  uchar *value;
  uchar *puVar2;
  byte *pbStack_40;
  uchar v;
  uchar *s;
  char *d;
  char *buffer;
  int dsize_local;
  void *data_local;
  char *key_local;
  Fl_Preferences *this_local;
  
  value = (uchar *)malloc((long)(dsize * 2 + 1));
  pbStack_40 = (byte *)data;
  s = value;
  for (buffer._4_4_ = dsize; 0 < buffer._4_4_; buffer._4_4_ = buffer._4_4_ + -1) {
    bVar1 = *pbStack_40;
    puVar2 = s + 1;
    *s = set::lu[(int)(uint)bVar1 >> 4];
    s = s + 2;
    *puVar2 = set::lu[(int)(bVar1 & 0xf)];
    pbStack_40 = pbStack_40 + 1;
  }
  *s = '\0';
  Node::set(this->node,key,(char *)value);
  free(value);
  return '\x01';
}

Assistant:

char Fl_Preferences::set( const char *key, const void *data, int dsize ) {
  char *buffer = (char*)malloc( dsize*2+1 ), *d = buffer;;
  unsigned char *s = (unsigned char*)data;
  for ( ; dsize>0; dsize-- ) {
    static char lu[] = "0123456789abcdef";
    unsigned char v = *s++;
    *d++ = lu[v>>4];
    *d++ = lu[v&0xf];
  }
  *d = 0;
  node->set( key, buffer );
  free( buffer );
  return 1;
}